

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O1

void duckdb::AddOptimizerMetrics
               (profiler_settings_t *settings,
               set<duckdb::OptimizerType,_std::less<duckdb::OptimizerType>,_std::allocator<duckdb::OptimizerType>_>
               *disabled_optimizers)

{
  undefined1 auVar1 [16];
  bool bVar2;
  __node_base_ptr p_Var3;
  __node_base _Var4;
  __hashtable *__h;
  profiler_settings_t optimizer_metrics;
  profiler_settings_t *local_60;
  _Hashtable<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_58;
  
  local_58._M_buckets._0_1_ = 0x10;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (settings->_M_h)._M_bucket_count;
  p_Var3 = ::std::
           _Hashtable<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           ::_M_find_before_node
                     (&settings->_M_h,SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x10)) % auVar1,0),
                      (key_type *)&local_58,0x10);
  if ((p_Var3 != (__node_base_ptr)0x0) && (p_Var3->_M_nxt != (_Hash_node_base *)0x0)) {
    MetricsUtils::GetOptimizerMetrics();
    if (local_58._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      _Var4._M_nxt = local_58._M_before_begin._M_nxt;
      do {
        bVar2 = IsEnabledOptimizer(*(MetricsType *)&_Var4._M_nxt[1]._M_nxt,disabled_optimizers);
        if (bVar2) {
          local_60 = settings;
          ::std::
          _Hashtable<duckdb::MetricsType,duckdb::MetricsType,std::allocator<duckdb::MetricsType>,std::__detail::_Identity,std::equal_to<duckdb::MetricsType>,duckdb::MetricsTypeHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<duckdb::MetricsType_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::MetricsType,true>>>>
                    ((_Hashtable<duckdb::MetricsType,duckdb::MetricsType,std::allocator<duckdb::MetricsType>,std::__detail::_Identity,std::equal_to<duckdb::MetricsType>,duckdb::MetricsTypeHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)settings,_Var4._M_nxt + 1,&local_60);
        }
        _Var4._M_nxt = (_Var4._M_nxt)->_M_nxt;
      } while (_Var4._M_nxt != (_Hash_node_base *)0x0);
    }
    ::std::
    _Hashtable<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_58);
  }
  return;
}

Assistant:

void AddOptimizerMetrics(profiler_settings_t &settings, const set<OptimizerType> &disabled_optimizers) {
	if (settings.find(MetricsType::ALL_OPTIMIZERS) != settings.end()) {
		auto optimizer_metrics = MetricsUtils::GetOptimizerMetrics();
		for (auto &metric : optimizer_metrics) {
			if (IsEnabledOptimizer(metric, disabled_optimizers)) {
				settings.insert(metric);
			}
		}
	}
}